

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
::fulfill(AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
          *this,AuthenticatedStream *value)

{
  undefined8 uVar1;
  ExceptionOrValue local_1c8;
  Maybe<kj::AuthenticatedStream> local_30;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1c8.exception.ptr.isSet = false;
    local_30.ptr.isSet = true;
    local_30.ptr.field_1.value.stream.disposer = (value->stream).disposer;
    local_30.ptr.field_1.value.stream.ptr = (value->stream).ptr;
    (value->stream).ptr = (AsyncIoStream *)0x0;
    local_30.ptr.field_1.value.peerIdentity.disposer = (value->peerIdentity).disposer;
    local_30.ptr.field_1.value.peerIdentity.ptr = (value->peerIdentity).ptr;
    (value->peerIdentity).ptr = (PeerIdentity *)0x0;
    ExceptionOrValue::operator=(&(this->result).super_ExceptionOrValue,&local_1c8);
    Maybe<kj::AuthenticatedStream>::operator=(&(this->result).value,&local_30);
    uVar1 = local_30.ptr.field_1.value.peerIdentity.ptr;
    if (local_30.ptr.isSet == true) {
      if (local_30.ptr.field_1.value.peerIdentity.ptr != (PeerIdentity *)0x0) {
        local_30.ptr.field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
        (**(local_30.ptr.field_1.value.peerIdentity.disposer)->_vptr_Disposer)
                  (local_30.ptr.field_1.value.peerIdentity.disposer,
                   ((PeerIdentity *)uVar1)->_vptr_PeerIdentity[-2] +
                   (long)&((PeerIdentity *)uVar1)->_vptr_PeerIdentity);
      }
      uVar1 = local_30.ptr.field_1.value.stream.ptr;
      if (local_30.ptr.field_1.value.stream.ptr != (AsyncIoStream *)0x0) {
        local_30.ptr.field_1.value.stream.ptr = (AsyncIoStream *)0x0;
        (**(local_30.ptr.field_1.value.stream.disposer)->_vptr_Disposer)
                  (local_30.ptr.field_1.value.stream.disposer,
                   (((AsyncIoStream *)uVar1)->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                   (long)&(((AsyncIoStream *)uVar1)->super_AsyncInputStream)._vptr_AsyncInputStream)
        ;
      }
    }
    if (local_1c8.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1c8.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }